

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask17_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x11 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xf;
  *puVar1 = in[2] << 2 | *puVar1;
  *puVar1 = in[3] << 0x13 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 0xd;
  *puVar1 = in[4] << 4 | *puVar1;
  *puVar1 = in[5] << 0x15 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] >> 0xb;
  *puVar1 = in[6] << 6 | *puVar1;
  *puVar1 = in[7] << 0x17 | *puVar1;
  out[4] = in[7] >> 9;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask17_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (17 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (17 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (17 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (17 - 8);
  ++in;

  return out + 1;
}